

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

void __thiscall ColorPrimariesBT2020::ColorPrimariesBT2020(ColorPrimariesBT2020 *this)

{
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  allocator_type local_f2;
  allocator_type local_f1;
  _Vector_base<float,_std::allocator<float>_> local_f0;
  ColorPrimaryTransform local_d4;
  _Vector_base<float,_std::allocator<float>_> local_b0;
  float local_98 [12];
  float local_68 [11];
  ColorPrimaryTransform local_3c;
  
  local_68[4] = 0.677998;
  local_68[5] = 0.059302;
  local_68[6] = 0.0;
  local_68[7] = 0.028073;
  local_68[0] = 0.636958;
  local_68[1] = 0.144617;
  local_68[2] = 0.168881;
  local_68[3] = 0.2627;
  local_68[8] = 1.060985;
  __l._M_len = 9;
  __l._M_array = local_68;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_f0,__l,&local_f1);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_d4,(vector<float,_std::allocator<float>_> *)&local_f0);
  local_98[4] = 1.616481;
  local_98[5] = 0.015769;
  local_98[6] = 0.01764;
  local_98[7] = -0.042771;
  local_98[0] = 1.716651;
  local_98[1] = -0.355671;
  local_98[2] = -0.253366;
  local_98[3] = -0.666684;
  local_98[8] = 0.942103;
  __l_00._M_len = 9;
  __l_00._M_array = local_98;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_b0,__l_00,&local_f2);
  ColorPrimaryTransform::ColorPrimaryTransform
            (&local_3c,(vector<float,_std::allocator<float>_> *)&local_b0);
  (this->super_ColorPrimaries).toXYZ.matrix[2][2] = local_d4.matrix[2][2];
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[1] + 1) = local_d4.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[2] = local_d4.matrix[2]._0_8_;
  *(undefined8 *)(this->super_ColorPrimaries).toXYZ.matrix[0] = local_d4.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).toXYZ.matrix[0] + 2) = local_d4.matrix._8_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[0] = local_3c.matrix[0]._0_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[0] + 2) = local_3c.matrix._8_8_;
  *(undefined8 *)((this->super_ColorPrimaries).fromXYZ.matrix[1] + 1) = local_3c.matrix[1]._4_8_;
  *(undefined8 *)(this->super_ColorPrimaries).fromXYZ.matrix[2] = local_3c.matrix[2]._0_8_;
  (this->super_ColorPrimaries).fromXYZ.matrix[2][2] = local_3c.matrix[2][2];
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_b0);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_f0);
  return;
}

Assistant:

ColorPrimariesBT2020() : ColorPrimaries(
        ColorPrimaryTransform({
            +0.636958f, +0.144617f, +0.168881f,
            +0.262700f, +0.677998f, +0.059302f,
            +0.000000f, +0.028073f, +1.060985f
        }),
        ColorPrimaryTransform({
            +1.716651f, -0.355671f, -0.253366f,
            -0.666684f, +1.616481f, +0.015769f,
            +0.017640f, -0.042771f, +0.942103f
        })
    ) {}